

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O2

void __thiscall BmsBms::Merge(BmsBms *this,BmsBms *other)

{
  _Rb_tree_node_base *p_Var1;
  BmsRegistArraySet *this_00;
  BmsRegistArraySet *this_01;
  uint uVar2;
  bool bVar3;
  Iterator IVar4;
  Iterator IVar5;
  ConstIterator CVar6;
  ConstIterator CVar7;
  BmsRegistArray *pBVar8;
  BmsRegistArray *this_02;
  string *value;
  _Base_ptr p_Var9;
  ConstIterator CVar10;
  ConstIterator CVar11;
  Iterator IVar12;
  Iterator IVar13;
  BmsWord *channel_number;
  BmsChannel *this_03;
  BmsBuffer *pBVar14;
  Iterator IVar15;
  Iterator IVar16;
  BmsDuplicateHeaderException *pBVar17;
  uint uVar18;
  int value_00;
  double d;
  BmsWord word;
  
  IVar4 = BmsHeaderTable::Begin_abi_cxx11_(&other->headers_);
  while( true ) {
    IVar5 = BmsHeaderTable::End_abi_cxx11_(&other->headers_);
    if (IVar4._M_node == IVar5._M_node) {
      this_00 = &other->array_set_;
      this_01 = &this->array_set_;
      value_00 = 0;
      do {
        if (value_00 == 0x510) {
          for (p_Var9 = (other->stp_manager_).stp_._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var9 !=
              &(other->stp_manager_).stp_._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            BmsSTPManager::Add(&this->stp_manager_,*(double *)(p_Var9 + 1),
                               *(int *)&p_Var9[1]._M_parent);
          }
          uVar18 = (other->bar_manager_).barresolution_;
          uVar2 = (this->bar_manager_).barresolution_;
          if (uVar18 != uVar2) {
            d = (double)uVar18 / (double)uVar2;
            BmsBarManager::SetResolution(&this->bar_manager_,d);
            IVar15 = BmsChannelManager::Begin(&this->channel_manager_);
            while( true ) {
              IVar16 = BmsChannelManager::End(&this->channel_manager_);
              if (IVar15._M_node == IVar16._M_node) break;
              BmsChannel::MultiplyBarDivisionCount((BmsChannel *)IVar15._M_node[1]._M_parent,d);
              IVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar15._M_node);
            }
          }
          CVar10 = BmsChannelManager::Begin(&other->channel_manager_);
          while( true ) {
            CVar11 = BmsChannelManager::End(&other->channel_manager_);
            if (CVar10._M_node == CVar11._M_node) break;
            p_Var9 = CVar10._M_node[1]._M_parent;
            IVar12 = BmsChannel::Begin((BmsChannel *)p_Var9);
            uVar18 = 0;
            while( true ) {
              IVar13 = BmsChannel::End((BmsChannel *)p_Var9);
              if (IVar12._M_current == IVar13._M_current) break;
              channel_number = BmsChannel::GetChannelNumber((BmsChannel *)p_Var9);
              this_03 = BmsChannelManager::operator[](&this->channel_manager_,channel_number);
              pBVar14 = BmsChannel::operator[](this_03,uVar18);
              (*pBVar14->_vptr_BmsBuffer[2])(pBVar14,*IVar12._M_current);
              uVar18 = uVar18 + 1;
              IVar12._M_current = IVar12._M_current + 1;
            }
            CVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(CVar10._M_node);
          }
          return;
        }
        BmsWord::BmsWord(&word,value_00);
        CVar6 = BmsRegistArraySet::Begin_abi_cxx11_(this_00);
        while( true ) {
          CVar7 = BmsRegistArraySet::End_abi_cxx11_(this_00);
          if (CVar6._M_node == CVar7._M_node) break;
          p_Var1 = CVar6._M_node + 1;
          bVar3 = BmsRegistArraySet::Exists(this_01,(string *)p_Var1);
          if (!bVar3) {
            BmsRegistArraySet::MakeNewArray(this_01,(string *)p_Var1);
          }
          pBVar8 = BmsRegistArraySet::operator[](this_00,(string *)p_Var1);
          bVar3 = BmsRegistArray::IsExists(pBVar8,&word);
          if (bVar3) {
            pBVar8 = BmsRegistArraySet::operator[](this_01,(string *)p_Var1);
            bVar3 = BmsRegistArray::IsExists(pBVar8,&word);
            if (bVar3) {
              pBVar17 = (BmsDuplicateHeaderException *)__cxa_allocate_exception(0x28);
              BmsDuplicateHeaderException::BmsDuplicateHeaderException(pBVar17,(string *)p_Var1);
              __cxa_throw(pBVar17,&BmsDuplicateHeaderException::typeinfo,
                          BmsDuplicateHeaderException::~BmsDuplicateHeaderException);
            }
            pBVar8 = BmsRegistArraySet::operator[](this_01,(string *)p_Var1);
            this_02 = BmsRegistArraySet::operator[](this_00,(string *)p_Var1);
            value = BmsRegistArray::operator[][abi_cxx11_(this_02,&word);
            BmsRegistArray::Set(pBVar8,&word,value);
          }
          CVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(CVar6._M_node);
        }
        BmsWord::~BmsWord(&word);
        value_00 = value_00 + 1;
      } while( true );
    }
    p_Var1 = IVar4._M_node + 1;
    bVar3 = BmsHeaderTable::IsExists(&this->headers_,(string *)p_Var1);
    if (bVar3) break;
    BmsHeader::ToString_abi_cxx11_((string *)&word,(BmsHeader *)(IVar4._M_node + 2));
    BmsHeaderTable::Set(&this->headers_,(string *)p_Var1,(string *)&word);
    std::__cxx11::string::~string((string *)&word);
    IVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar4._M_node);
  }
  pBVar17 = (BmsDuplicateHeaderException *)__cxa_allocate_exception(0x28);
  BmsDuplicateHeaderException::BmsDuplicateHeaderException(pBVar17,(string *)p_Var1);
  __cxa_throw(pBVar17,&BmsDuplicateHeaderException::typeinfo,
              BmsDuplicateHeaderException::~BmsDuplicateHeaderException);
}

Assistant:

void
BmsBms::Merge(const BmsBms& other)
{
	// merge BmsHeaderTable
	// throw exception when duplicated header exists
	for (BmsHeaderTable::Iterator it = other.headers_.Begin(); it != other.headers_.End(); ++it) {
		if (headers_.IsExists(it->first)) {
			throw BmsDuplicateHeaderException(it->first);
		}
		headers_.Set(it->first, it->second.ToString());
	}
	// merge all registed information (#WAV, #BMP, etc channel)
	// if same key exists, then raise exception
	for (unsigned int i = 0; i < BmsConst::WORD_MAX_COUNT; ++i) {
		BmsWord word(i);
		for (BmsRegistArraySet::ConstIterator it = other.array_set_.Begin(); it != other.array_set_.End(); ++it) {
			if (NOT(array_set_.Exists(it->first))) {
				array_set_.MakeNewArray(it->first);
			}
			if (other.array_set_[it->first].IsExists(word)) {
				if (array_set_[it->first].IsExists(word)) {
					throw BmsDuplicateHeaderException(it->first);
				}
				array_set_[it->first].Set(word, other.array_set_[it->first][word]);
			}
		}
	}
	// merge STP
	for (auto it = other.stp_manager_.Begin(); it != other.stp_manager_.End(); ++it) {
		stp_manager_.Add(it->first, it->second);
	}

	// before channel merge, check resolution
	// other one is const, so there's only one way - match my resolution to others ...
	if (other.bar_manager_.GetResolution() != bar_manager_.GetResolution()) {
		double ratio = (double)other.bar_manager_.GetResolution() / bar_manager_.GetResolution();
		bar_manager_.SetResolution(ratio);
		for (auto it = channel_manager_.Begin(); it != channel_manager_.End(); ++it) {
			it->second->MultiplyBarDivisionCount(ratio);
		}
	}

	// merge channel
	for (BmsChannelManager::ConstIterator it = other.channel_manager_.Begin(); it != other.channel_manager_.End(); ++it) {
		unsigned int i = 0;
		BmsChannel& current_channel = *it->second;
		for (BmsChannel::ConstIterator current_buffer = current_channel.Begin(); current_buffer != current_channel.End(); ++current_buffer) {\
			channel_manager_[current_channel.GetChannelNumber()][i].Merge(**current_buffer);
			++i;
		}
	}
}